

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsKrylovDemo_ls.c
# Opt level: O3

int PSolve(sunrealtype tn,N_Vector u,N_Vector fu,N_Vector r,N_Vector z,sunrealtype gamma,
          sunrealtype delta,int lr,void *user_data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar2 = (long)user_data + 0x640;
  lVar1 = N_VGetArrayPointer(z);
  N_VScale(0x3ff0000000000000,r,z);
  lVar3 = 0;
  do {
    lVar4 = 0;
    lVar5 = lVar1;
    do {
      SUNDlsMat_denseGETRS
                (*(undefined8 *)(lVar2 + -0x640 + lVar4 * 8),2,*(undefined8 *)(lVar2 + lVar4 * 8),
                 lVar5);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xa0;
    } while (lVar4 != 10);
    lVar3 = lVar3 + 1;
    lVar1 = lVar1 + 0x10;
    lVar2 = lVar2 + 0x50;
  } while (lVar3 != 10);
  return 0;
}

Assistant:

static int PSolve(sunrealtype tn, N_Vector u, N_Vector fu, N_Vector r, N_Vector z,
                  sunrealtype gamma, sunrealtype delta, int lr, void* user_data)
{
  sunrealtype**(*P)[MY];
  sunindextype*(*pivot)[MY];
  int jx, jy;
  sunrealtype *zdata, *v;
  UserData data;

  /* Extract the P and pivot arrays from user_data. */

  data  = (UserData)user_data;
  P     = data->P;
  pivot = data->pivot;
  zdata = N_VGetArrayPointer(z);

  N_VScale(ONE, r, z);

  /* Solve the block-diagonal system Px = r using LU factors stored
     in P and pivot data in pivot, and return the solution in z. */

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      v = &(IJKth(zdata, 1, jx, jy));
      SUNDlsMat_denseGETRS(P[jx][jy], NUM_SPECIES, pivot[jx][jy], v);
    }
  }

  return (0);
}